

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

AggregateFunctionSet * duckdb::MinFun::GetFunctions(void)

{
  vector<duckdb::AggregateFunction,_true> *this;
  AggregateFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_311;
  LogicalType local_310;
  LogicalType local_2f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2e0;
  LogicalType local_2c8 [2];
  string local_298;
  AggregateFunction local_278;
  AggregateFunction local_148;
  
  ::std::__cxx11::string::string((string *)&local_298,"min",(allocator *)local_2c8);
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_298);
  ::std::__cxx11::string::~string((string *)&local_298);
  MinFunction::GetFunction();
  this = &(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_148);
  AggregateFunction::~AggregateFunction(&local_148);
  LogicalType::LogicalType(local_2c8,ANY);
  LogicalType::LogicalType(local_2c8 + 1,BIGINT);
  __l._M_len = 2;
  __l._M_array = local_2c8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2e0,__l,&local_311);
  LogicalType::LogicalType(&local_310,ANY);
  LogicalType::LIST(&local_2f8,&local_310);
  AggregateFunction::AggregateFunction
            (&local_278,(vector<duckdb::LogicalType,_true> *)&local_2e0,&local_2f8,
             (aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,
             MinMaxNBind<duckdb::LessThan>,(aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,
             (aggregate_window_t)0x0,(aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_2f8);
  LogicalType::~LogicalType(&local_310);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2e0);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_2c8[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_278);
  AggregateFunction::~AggregateFunction(&local_278);
  return in_RDI;
}

Assistant:

AggregateFunctionSet MinFun::GetFunctions() {
	AggregateFunctionSet min("min");
	min.AddFunction(MinFunction::GetFunction());
	min.AddFunction(GetMinMaxNFunction<LessThan>());
	return min;
}